

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<std::__cxx11::wstring>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *needle,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *haystack)

{
  AssertionResult *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  undefined1 auVar3 [16];
  AssertionResult AVar4;
  char *begin_string_quote;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  AssertionResult local_38;
  
  local_50 = haystack_expr;
  local_48 = needle_expr;
  auVar3 = std::__cxx11::wstring::find((wchar_t *)haystack,*(ulong *)needle,0);
  sVar2.ptr_ = auVar3._8_8_;
  if ((auVar3._0_8_ != -1) == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_58 = "L\"";
    local_38.success_ = false;
    local_38.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar1 = AssertionResult::operator<<(&local_38,(char (*) [11])"Value of: ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x138d73);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [11])0x1385f5);
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = AssertionResult::operator<<(pAVar1,needle);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x138e24);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [11])0x138601);
    local_40 = "not ";
    if (expected_to_be_substring) {
      local_40 = "";
    }
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [16])"a substring of ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x138d73);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [11])0x13861e);
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = AssertionResult::operator<<(pAVar1,haystack);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x13a073);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
    internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_38.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar2.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}